

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_stmt_t * gs_parse_stmt_for(gs_parser_t *parser)

{
  gs_token_t token_00;
  gs_token_t decl_symbol_00;
  undefined1 auVar1 [8];
  _Bool _Var2;
  gs_expr_t *init_00;
  gs_expr_t *cond_00;
  gs_expr_t *inc_00;
  gs_stmt_t *body_00;
  gs_token_t local_118;
  gs_token_t local_100;
  gs_token_t local_e8;
  gs_token_t local_d0;
  gs_token_t local_b8;
  undefined1 local_a0 [16];
  anon_union_8_5_f029217d_for_gs_token_3 local_90;
  undefined1 local_88 [8];
  gs_token_t decl_symbol;
  gs_val_type decl_type;
  undefined1 local_50 [8];
  gs_token_t token;
  gs_stmt_t *stmt;
  gs_stmt_t *body;
  gs_expr_t *inc;
  gs_expr_t *cond;
  gs_expr_t *init;
  gs_parser_t *parser_local;
  
  token.field_3.symbol = (char *)0x0;
  gs_peek((gs_token_t *)local_50,parser);
  _Var2 = gs_eat_char(parser,'(');
  if (!_Var2) {
    gs_peek((gs_token_t *)&stack0xffffffffffffff98,parser);
    gs_parser_error(parser,0x3097f3);
    return (gs_stmt_t *)token.field_3.symbol;
  }
  gs_peek((gs_token_t *)local_88,parser);
  _Var2 = gs_eat_val_type(parser,(gs_val_type *)((long)&decl_symbol.field_3 + 4));
  if (_Var2) {
    gs_peek((gs_token_t *)local_a0,parser);
    local_88 = (undefined1  [8])local_a0._0_8_;
    auVar1 = local_88;
    decl_symbol.type = local_a0._8_4_;
    decl_symbol.line = local_a0._12_4_;
    decl_symbol._8_8_ = local_90;
    local_88._0_4_ = (undefined4)local_a0._0_8_;
    local_88 = auVar1;
    if (local_88._0_4_ != GS_TOKEN_SYMBOL) {
      gs_peek(&local_b8,parser);
      gs_parser_error(parser,0x30981b);
      return (gs_stmt_t *)token.field_3.symbol;
    }
    gs_eat(parser);
    _Var2 = gs_eat_char(parser,'=');
    if (!_Var2) {
      gs_peek(&local_d0,parser);
      gs_parser_error(parser,0x30985d);
      return (gs_stmt_t *)token.field_3.symbol;
    }
  }
  init_00 = gs_parse_expr(parser);
  if ((parser->error & 1U) == 0) {
    _Var2 = gs_eat_char(parser,';');
    if (_Var2) {
      cond_00 = gs_parse_expr(parser);
      if ((parser->error & 1U) == 0) {
        _Var2 = gs_eat_char(parser,';');
        if (_Var2) {
          inc_00 = gs_parse_expr(parser);
          if ((parser->error & 1U) == 0) {
            _Var2 = gs_eat_char(parser,')');
            if (_Var2) {
              body_00 = gs_parse_stmt(parser);
              if ((parser->error & 1U) == 0) {
                token_00.col = token.type;
                token_00._12_4_ = token.line;
                token_00.type = local_50._0_4_;
                token_00.line = local_50._4_4_;
                token_00.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
                decl_symbol_00.col = decl_symbol.type;
                decl_symbol_00._12_4_ = decl_symbol.line;
                decl_symbol_00.type = local_88._0_4_;
                decl_symbol_00.line = local_88._4_4_;
                decl_symbol_00.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)decl_symbol._8_8_;
                token.field_3.symbol =
                     (char *)gs_stmt_for_new(parser,token_00,decl_symbol.field_3._4_4_,
                                             decl_symbol_00,init_00,cond_00,inc_00,body_00);
              }
            }
            else {
              gs_peek(&local_118,parser);
              gs_parser_error(parser,0x3098c4);
            }
          }
        }
        else {
          gs_peek(&local_100,parser);
          gs_parser_error(parser,0x30989c);
        }
      }
    }
    else {
      gs_peek(&local_e8,parser);
      gs_parser_error(parser,0x30989c);
    }
  }
  return (gs_stmt_t *)token.field_3.symbol;
}

Assistant:

static gs_stmt_t *gs_parse_stmt_for(gs_parser_t *parser) {
    gs_expr_t *init, *cond, *inc;
    gs_stmt_t *body;

    gs_stmt_t *stmt = NULL;
    gs_token_t token = gs_peek(parser);

    if (!gs_eat_char(parser, '(')) {
        gs_parser_error(parser, gs_peek(parser), "Expected '(' when parsing for statement");
        goto cleanup;
    }

    gs_val_type decl_type;
    gs_token_t decl_symbol = gs_peek(parser);
    if (gs_eat_val_type(parser, &decl_type)) {
        decl_symbol = gs_peek(parser);
        if (decl_symbol.type != GS_TOKEN_SYMBOL) {
            gs_parser_error(parser, gs_peek(parser), "Expected symbol when parsing variable declaration in for statment");
            goto cleanup;
        }
        gs_eat(parser);

        if (!gs_eat_char(parser, '=')) {
            gs_parser_error(parser, gs_peek(parser), "Expected '=' when parsing variable declaration in for statment");
            goto cleanup;
        }
    }

    init = gs_parse_expr(parser);
    if (parser->error) goto cleanup;

    if (!gs_eat_char(parser, ';')) {
        gs_parser_error(parser, gs_peek(parser), "Expected ';' when parsing for statement");
        goto cleanup;
    }

    cond = gs_parse_expr(parser);
    if (parser->error) goto cleanup;

    if (!gs_eat_char(parser, ';')) {
        gs_parser_error(parser, gs_peek(parser), "Expected ';' when parsing for statement");
        goto cleanup;
    }

    inc = gs_parse_expr(parser);
    if (parser->error) goto cleanup;

    if (!gs_eat_char(parser, ')')) {
        gs_parser_error(parser, gs_peek(parser), "Expected ')' when parsing for statement");
        goto cleanup;
    }

    body = gs_parse_stmt(parser);
    if (parser->error) goto cleanup;

    stmt = gs_stmt_for_new(parser, token, decl_type, decl_symbol, init, cond, inc, body);

cleanup:
    return stmt;
}